

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O2

GrcEnv * __thiscall GrcManager::PushPassEnv(GrcManager *this,GrpLineAndFile *lnf,int nPass)

{
  GrcSymbolTableEntry *this_00;
  bool bVar1;
  GrcEnv *pGVar2;
  allocator local_79;
  string local_78;
  string local_58;
  pair<GrcSymbolTableEntry_*,_int> local_38;
  
  pGVar2 = PushEnvAux(this);
  pGVar2->m_nPass = nPass;
  this_00 = pGVar2->m_psymTable;
  local_38.first = this_00;
  local_38.second = nPass;
  std::
  _Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
  ::_M_emplace_unique<std::pair<GrcSymbolTableEntry*,int>&>
            ((_Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
              *)&this->m_hmpsymnCurrPass,&local_38);
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtTableRule);
  if (!bVar1) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_58,this_00);
    std::__cxx11::string::string((string *)&local_78," table cannot hold passes",&local_79);
    GrcErrorList::AddError(&g_errorList,0x49e,(GdlObject *)0x0,&local_58,&local_78,lnf);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return pGVar2;
}

Assistant:

GrcEnv * GrcManager::PushPassEnv(GrpLineAndFile & lnf, int nPass)
{
	GrcEnv * penvNew = PushEnvAux();

	penvNew->SetPass(nPass);

	Symbol psymTable = penvNew->Table();

	std::pair<Symbol, int> hmpair;
	hmpair.first = psymTable;
	hmpair.second = nPass;
	m_hmpsymnCurrPass.insert(hmpair);
	//m_hmpsymnCurrPass.Insert(psymTable, nPass, true);

	if (!psymTable->FitsSymbolType(ksymtTableRule))
	{
		g_errorList.AddError(1182, NULL,
			psymTable->FullName(),
			" table cannot hold passes",
			lnf);
	}

	return penvNew;
}